

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_265da4::SndioCapture::start(SndioCapture *this)

{
  int iVar1;
  backend_exception *this_00;
  thread local_28;
  long *local_20;
  
  iVar1 = sio_start(this->mSndHandle);
  if (iVar1 != 0) {
    (this->mKillNow)._M_base._M_i = false;
    local_28._M_id._M_thread = (id)0;
    local_20 = (long *)::operator_new(0x20);
    *local_20 = (long)&PTR___State_001ac9d0;
    local_20[1] = (long)this;
    local_20[2] = (long)recordProc;
    local_20[3] = 0;
    std::thread::_M_start_thread(&local_28,&local_20,0);
    if (local_20 != (long *)0x0) {
      (**(code **)(*local_20 + 8))();
    }
    std::thread::operator=(&this->mThread,&local_28);
    std::thread::~thread(&local_28);
    return;
  }
  this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
  al::backend_exception::backend_exception(this_00,0xa001,"Error starting capture");
  __cxa_throw(this_00,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void SndioCapture::start()
{
    if(!sio_start(mSndHandle))
        throw al::backend_exception{ALC_INVALID_DEVICE, "Error starting capture"};

    try {
        mKillNow.store(false, std::memory_order_release);
        mThread = std::thread{std::mem_fn(&SndioCapture::recordProc), this};
    }
    catch(std::exception& e) {
        sio_stop(mSndHandle);
        throw al::backend_exception{ALC_INVALID_DEVICE, "Failed to start mixing thread: %s",
            e.what()};
    }
}